

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O2

void Fraig_TablePrintStatsF0(Fraig_Man_t *pMan)

{
  printf("Zero-node table. Table size = %d. Number of entries = %d.\n",
         (ulong)(uint)pMan->pTableF0->nBins,(ulong)(uint)pMan->pTableF0->nEntries);
  putchar(10);
  return;
}

Assistant:

void Fraig_TablePrintStatsF0( Fraig_Man_t * pMan )
{
    Fraig_HashTable_t * pT = pMan->pTableF0;
    Fraig_Node_t * pNode;
    int i, Counter;

    printf( "Zero-node table. Table size = %d. Number of entries = %d.\n", pT->nBins, pT->nEntries );
    for ( i = 0; i < pT->nBins; i++ )
    {
        Counter = 0;
        Fraig_TableBinForEachEntryF( pT->pBins[i], pNode )
            Counter++;
        if ( Counter == 0 )
            continue;
/*
        printf( "\nBin = %4d :  Number of entries = %4d\n", i, Counter );
        Fraig_TableBinForEachEntryF( pT->pBins[i], pNode )
            printf( "Node %5d. Hash = %10d.\n", pNode->Num, pNode->uHashD );
*/
    }
    printf( "\n" );
}